

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

array<float,_4UL>
tinyusdz::value::MultV<tinyusdz::value::matrix4d,std::array<float,4ul>,double,float,4ul>
          (matrix4d *m,array<float,_4UL> *v)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  ulong local_40;
  size_t i;
  Ty value;
  size_t j;
  array<float,_4UL> *v_local;
  matrix4d *m_local;
  array<float,_4UL> ret;
  
  for (value = 0.0; (ulong)value < 4; value = (Ty)((long)value + 1)) {
    i = 0;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      dVar1 = m->m[local_40][(long)value];
      pvVar2 = ::std::array<float,_4UL>::operator[](v,local_40);
      i = (size_t)(dVar1 * (double)*pvVar2 + (double)i);
    }
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&m_local,(size_type)value);
    *pvVar3 = (float)(double)i;
  }
  return (array<float,_4UL>)_m_local;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}